

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqldatabase.cpp
# Opt level: O2

void QSqlDatabase::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  NumericalPrecisionPolicy *pNVar1;
  NumericalPrecisionPolicy NVar2;
  
  if (_c == WriteProperty) {
    if (_id == 0) {
      setNumericalPrecisionPolicy((QSqlDatabase *)_o,**_a);
      return;
    }
  }
  else if ((_c == ReadProperty) && (_id == 0)) {
    pNVar1 = (NumericalPrecisionPolicy *)*_a;
    NVar2 = numericalPrecisionPolicy((QSqlDatabase *)_o);
    *pNVar1 = NVar2;
    return;
  }
  return;
}

Assistant:

void QSqlDatabase::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QSqlDatabase *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v) = _t->numericalPrecisionPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNumericalPrecisionPolicy(*reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v)); break;
        default: break;
        }
    }
}